

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_generic_section.cpp
# Opt level: O2

void __thiscall
GenericSectionImport_TextBadInternalFixupsType_Test::TestBody
          (GenericSectionImport_TextBadInternalFixupsType_Test *this)

{
  char *message;
  not_null<pstore::repo::section_content_*> expected_predicate_value;
  error_code eVar1;
  not_null<pstore::repo::section_content_*> in_stack_fffffffffffffd78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_280;
  AssertHelper local_278;
  AssertionResult gtest_ar_;
  back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  inserter;
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  dispatchers;
  not_null<pstore::repo::section_content_*> local_228;
  not_null<pstore::database_*> local_220;
  AssertionResult gtest_ar;
  _List_node_base _Stack_200;
  size_type sStack_1f0;
  _List_node_base local_1e8;
  __node_base_ptr local_1d8;
  __node_base_ptr *pp_Stack_1d0;
  size_type local_1c8;
  __node_base _Stack_1c0;
  size_type local_1b8;
  _Prime_rehash_policy _Stack_1b0;
  __node_base_ptr p_Stack_1a0;
  parser<pstore::exchange::import_ns::callbacks> local_198;
  section_content imported_content;
  
  inserter.container = &dispatchers;
  dispatchers.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dispatchers.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dispatchers.
  super__Vector_base<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_content.kind = text;
  imported_content.align = '\x01';
  memset(&imported_content.data,0,0xa0);
  imported_content.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_content.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_content.ifixups.
  super__Vector_base<pstore::repo::internal_fixup,_std::allocator<pstore::repo::internal_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_content.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_content.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_content.xfixups.
  super__Vector_base<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_content.data.buffer_ = imported_content.data.small_buffer_._M_elems;
  std::__cxx11::string::string
            ((string *)&gtest_ar_,"{ \"align\":8, \"data\":\"\", \"ifixups\":true }",
             (allocator *)&local_280);
  local_220.ptr_ = &(this->super_GenericSectionImport).db_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_220);
  _Stack_200._M_next = &_Stack_200;
  sStack_1f0 = 0;
  local_1d8 = (__node_base_ptr)0x0;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_1e8._M_next = &local_1e8;
  pp_Stack_1d0 = &p_Stack_1a0;
  local_1c8 = 1;
  _Stack_1c0._M_nxt = (_Hash_node_base *)0x0;
  local_1b8 = 0;
  _Stack_1b0._M_max_load_factor = 1.0;
  _Stack_1b0._4_4_ = 0;
  _Stack_1b0._M_next_resize = 0;
  p_Stack_1a0 = (__node_base_ptr)0x0;
  local_228.ptr_ = &imported_content;
  _Stack_200._M_prev = _Stack_200._M_next;
  local_1e8._M_prev = local_1e8._M_next;
  pstore::gsl::not_null<pstore::repo::section_content_*>::ensure_invariant(&local_228);
  expected_predicate_value.ptr_ = local_228.ptr_;
  (anonymous_namespace)::
  parse<(pstore::repo::section_kind)0,std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
            (&local_198,(_anonymous_namespace_ *)&gtest_ar_,(string *)local_220.ptr_,
             (database *)&gtest_ar,(string_mapping *)&inserter,
             (back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
              *)local_228.ptr_,in_stack_fffffffffffffd78);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = local_198.error_._M_value != 0;
  if (local_198.error_._M_value == 0) {
    testing::Message::Message((Message *)&local_280);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x1b88f8,"false","true"
               ,(char *)expected_predicate_value.ptr_);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0x16c,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=(&local_278,(Message *)&local_280);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if (local_280._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_280._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  eVar1 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )eVar1._M_cat;
  gtest_ar_._0_4_ = eVar1._M_value;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&gtest_ar,"parser.last_error ()",
             "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",
             &local_198.error_,(error_code *)&gtest_ar_);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_generic_section.cpp"
               ,0x16e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_280,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_280);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser(&local_198);
  pstore::repo::section_content::~section_content(&imported_content);
  std::
  vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
  ::~vector(&dispatchers);
  return;
}

Assistant:

TEST_F (GenericSectionImport, TextBadInternalFixupsType) {
    std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher>> dispatchers;
    auto inserter = std::back_inserter (dispatchers);
    pstore::repo::section_content imported_content;

    // The ifixups value is a boolean rather than an array.
    auto const & parser = parse<pstore::repo::section_kind::text> (
        R"({ "align":8, "data":"", "ifixups":true })", &db_,
        pstore::exchange::import_ns::string_mapping{}, &inserter, &imported_content);
    EXPECT_TRUE (parser.has_error ());
    EXPECT_EQ (parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
}